

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-oid.c
# Opt level: O3

void test_bson_oid_init(void)

{
  char *pcVar1;
  __int32_t *p_Var2;
  long lVar3;
  char cVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  __int32_t **pp_Var8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  bson_oid_t oid;
  bson_oid_t oid2;
  pthread_t apStack_1d0 [4];
  pthread_t apStack_1b0 [4];
  undefined8 uStack_190;
  undefined1 *puStack_188;
  code *pcStack_180;
  undefined1 auStack_178 [12];
  undefined1 auStack_16c [12];
  undefined8 uStack_160;
  undefined1 *puStack_158;
  undefined1 *puStack_150;
  code *pcStack_148;
  undefined1 auStack_140 [12];
  undefined1 auStack_134 [12];
  undefined8 uStack_128;
  undefined1 *puStack_120;
  undefined1 *puStack_118;
  code *pcStack_110;
  undefined1 auStack_108 [12];
  undefined1 auStack_fc [12];
  long lStack_f0;
  undefined1 *puStack_e8;
  char *pcStack_e0;
  code *pcStack_d8;
  undefined1 auStack_c4 [12];
  long lStack_b8;
  char acStack_b0 [32];
  char acStack_90 [24];
  undefined1 uStack_78;
  undefined8 uStack_68;
  undefined1 auStack_38 [12];
  undefined1 local_2c [12];
  
  uVar6 = bson_context_new(0);
  bson_oid_init(auStack_38,uVar6);
  iVar12 = 10000;
  do {
    bson_oid_init(local_2c,uVar6);
    cVar4 = bson_oid_equal(auStack_38,local_2c);
    if (cVar4 != '\0') {
      test_bson_oid_init_cold_3();
LAB_0013510a:
      test_bson_oid_init_cold_1();
      goto LAB_0013510f;
    }
    iVar5 = bson_oid_compare(auStack_38,local_2c);
    if (-1 < iVar5) goto LAB_0013510a;
    bson_oid_copy(local_2c,auStack_38);
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  bson_context_destroy(uVar6);
  bson_oid_init(auStack_38,0);
  lVar7 = bson_context_get_default();
  if (lVar7 != 0) {
    return;
  }
LAB_0013510f:
  test_bson_oid_init_cold_2();
  lVar11 = 0;
  pcStack_d8 = (code *)0x13512b;
  uStack_68 = uVar6;
  lVar7 = bson_context_new(0);
  do {
    pcVar1 = *(char **)((long)gTestOids + lVar11);
    pcStack_d8 = (code *)0x13514e;
    bson_oid_init_from_string(auStack_c4,pcVar1);
    pcStack_d8 = (code *)0x135159;
    bson_oid_to_string(auStack_c4,acStack_b0);
    pcStack_d8 = (code *)0x135164;
    iVar12 = strcmp(acStack_b0,pcVar1);
    if (iVar12 != 0) {
      pcStack_d8 = (code *)0x1352bf;
      test_bson_oid_init_from_string_cold_1();
      goto LAB_001352bf;
    }
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0x40);
  lVar14 = 0;
  lStack_b8 = lVar7;
  do {
    pcVar1 = gTestOidsCase[lVar14];
    pcStack_d8 = (code *)0x1351a2;
    bson_oid_init_from_string(auStack_c4,pcVar1);
    pcStack_d8 = (code *)0x1351ad;
    bson_oid_to_string(auStack_c4,acStack_b0);
    pcStack_d8 = (code *)0x1351b8;
    iVar12 = bson_strcasecmp(acStack_b0,pcVar1);
    lVar7 = lVar14;
    if (iVar12 != 0) goto LAB_001352bf;
    lVar11 = CONCAT71((int7)((ulong)lVar11 >> 8),*pcVar1);
    if (*pcVar1 != '\0') {
      pcStack_d8 = (code *)0x1351cd;
      pp_Var8 = __ctype_tolower_loc();
      p_Var2 = *pp_Var8;
      lVar10 = 0;
      do {
        acStack_90[lVar10] = (char)p_Var2[(char)lVar11];
        lVar3 = lVar10 + 1;
        lVar11 = CONCAT71((int7)((ulong)lVar11 >> 8),pcVar1[lVar3]);
        lVar10 = lVar10 + 1;
      } while (pcVar1[lVar3] != '\0');
    }
    uStack_78 = 0;
    pcStack_d8 = (code *)0x1351f9;
    iVar12 = strcmp(acStack_b0,acStack_90);
    if (iVar12 != 0) goto LAB_001352c4;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  pcStack_d8 = (code *)0x13521b;
  cVar4 = bson_oid_is_valid("ffffffffffffffffffffffff",0x18);
  lVar7 = lVar14;
  if (cVar4 != '\0') {
    pcStack_d8 = (code *)0x135237;
    bson_oid_init_from_string(auStack_c4,"ffffffffffffffffffffffff");
    pcStack_d8 = (code *)0x135247;
    bson_oid_to_string(auStack_c4,acStack_b0);
    pcStack_d8 = (code *)0x135254;
    cVar4 = bson_oid_is_valid(acStack_b0,0x19);
    lVar7 = lStack_b8;
    if (cVar4 == '\0') goto LAB_001352d3;
    lVar11 = 0;
    while( true ) {
      pcVar1 = *(char **)((long)gTestOidsFail + lVar11);
      pcStack_d8 = (code *)0x13527f;
      bson_oid_init_from_string(auStack_c4,pcVar1);
      pcStack_d8 = (code *)0x13528a;
      bson_oid_to_string(auStack_c4,acStack_b0);
      pcStack_d8 = (code *)0x135295;
      iVar12 = strcmp(acStack_b0,pcVar1);
      if (iVar12 == 0) break;
      lVar11 = lVar11 + 8;
      if (lVar11 == 0x28) {
        pcStack_d8 = (code *)0x1352ab;
        bson_context_destroy(lVar7);
        return;
      }
    }
    goto LAB_001352c9;
  }
LAB_001352ce:
  pcStack_d8 = (code *)0x1352d3;
  test_bson_oid_init_from_string_cold_4();
  lVar14 = lVar7;
LAB_001352d3:
  pcStack_d8 = test_bson_oid_init_sequence;
  test_bson_oid_init_from_string_cold_5();
  pcStack_110 = (code *)0x1352e9;
  lStack_f0 = lVar11;
  puStack_e8 = auStack_c4;
  pcStack_e0 = acStack_b0;
  pcStack_d8 = (code *)lVar14;
  uVar6 = bson_context_new(0);
  pcStack_110 = (code *)0x1352fc;
  bson_oid_init_sequence(auStack_fc,uVar6);
  uVar15 = 10000;
  while( true ) {
    pcStack_110 = (code *)0x13530f;
    bson_oid_init_sequence(auStack_108,uVar6);
    pcStack_110 = (code *)0x13531a;
    cVar4 = bson_oid_equal(auStack_fc,auStack_108);
    if (cVar4 != '\0') break;
    pcStack_110 = (code *)0x135329;
    iVar12 = bson_oid_compare(auStack_fc,auStack_108);
    if (-1 < iVar12) goto LAB_00135354;
    pcStack_110 = (code *)0x135338;
    bson_oid_copy(auStack_108,auStack_fc);
    uVar13 = (int)uVar15 - 1;
    uVar15 = (ulong)uVar13;
    if (uVar13 == 0) {
      pcStack_110 = (code *)0x135344;
      bson_context_destroy(uVar6);
      return;
    }
  }
  pcStack_110 = (code *)0x135354;
  test_bson_oid_init_sequence_cold_2();
LAB_00135354:
  pcStack_110 = test_bson_oid_init_sequence_thread_safe;
  test_bson_oid_init_sequence_cold_1();
  pcStack_148 = (code *)0x13536d;
  uStack_128 = uVar6;
  puStack_120 = auStack_fc;
  puStack_118 = auStack_108;
  pcStack_110 = (code *)uVar15;
  uVar6 = bson_context_new(1);
  pcStack_148 = (code *)0x135380;
  bson_oid_init_sequence(auStack_134,uVar6);
  uVar15 = 10000;
  while( true ) {
    pcStack_148 = (code *)0x135393;
    bson_oid_init_sequence(auStack_140,uVar6);
    pcStack_148 = (code *)0x13539e;
    cVar4 = bson_oid_equal(auStack_134,auStack_140);
    if (cVar4 != '\0') break;
    pcStack_148 = (code *)0x1353ad;
    iVar12 = bson_oid_compare(auStack_134,auStack_140);
    if (-1 < iVar12) goto LAB_001353d8;
    pcStack_148 = (code *)0x1353bc;
    bson_oid_copy(auStack_140,auStack_134);
    uVar13 = (int)uVar15 - 1;
    uVar15 = (ulong)uVar13;
    if (uVar13 == 0) {
      pcStack_148 = (code *)0x1353c8;
      bson_context_destroy(uVar6);
      return;
    }
  }
  pcStack_148 = (code *)0x1353d8;
  test_bson_oid_init_sequence_thread_safe_cold_2();
LAB_001353d8:
  pcStack_148 = test_bson_oid_init_sequence_with_tid;
  test_bson_oid_init_sequence_thread_safe_cold_1();
  pcStack_180 = (code *)0x1353f1;
  uStack_160 = uVar6;
  puStack_158 = auStack_134;
  puStack_150 = auStack_140;
  pcStack_148 = (code *)uVar15;
  uVar6 = bson_context_new(8);
  pcStack_180 = (code *)0x135404;
  bson_oid_init_sequence(auStack_16c,uVar6);
  iVar12 = 10000;
  while( true ) {
    pcStack_180 = (code *)0x135417;
    bson_oid_init_sequence(auStack_178,uVar6);
    pcStack_180 = (code *)0x135422;
    cVar4 = bson_oid_equal(auStack_16c);
    if (cVar4 != '\0') break;
    pcStack_180 = (code *)0x135431;
    iVar5 = bson_oid_compare(auStack_16c);
    if (-1 < iVar5) goto LAB_0013545c;
    pcStack_180 = (code *)0x135440;
    bson_oid_copy(auStack_178,auStack_16c);
    iVar12 = iVar12 + -1;
    if (iVar12 == 0) {
      pcStack_180 = (code *)0x13544c;
      bson_context_destroy(uVar6);
      return;
    }
  }
  pcStack_180 = (code *)0x13545c;
  test_bson_oid_init_sequence_with_tid_cold_2();
LAB_0013545c:
  pcStack_180 = test_bson_oid_init_with_threads;
  test_bson_oid_init_sequence_with_tid_cold_1();
  lVar7 = 0;
  uStack_190 = uVar6;
  puStack_188 = auStack_16c;
  pcStack_180 = (code *)auStack_178;
  do {
    pvVar9 = (void *)bson_context_new(8);
    *(void **)((long)apStack_1d0 + lVar7) = pvVar9;
    pthread_create((pthread_t *)((long)apStack_1b0 + lVar7),(pthread_attr_t *)0x0,oid_worker,pvVar9)
    ;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x20);
  lVar7 = 0;
  do {
    pthread_join(apStack_1b0[lVar7],(void **)0x0);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0;
  do {
    bson_context_destroy(apStack_1d0[lVar7]);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  pvVar9 = (void *)bson_context_new(1);
  lVar7 = 0;
  do {
    pthread_create((pthread_t *)((long)apStack_1d0 + lVar7),(pthread_attr_t *)0x0,oid_worker,pvVar9)
    ;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x20);
  lVar7 = 0;
  do {
    pthread_join(apStack_1d0[lVar7],(void **)0x0);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  bson_context_destroy(pvVar9);
  return;
LAB_001352bf:
  pcStack_d8 = (code *)0x1352c4;
  test_bson_oid_init_from_string_cold_2();
LAB_001352c4:
  pcStack_d8 = (code *)0x1352c9;
  test_bson_oid_init_from_string_cold_3();
LAB_001352c9:
  pcStack_d8 = (code *)0x1352ce;
  test_bson_oid_init_from_string_cold_6();
  goto LAB_001352ce;
}

Assistant:

static void
test_bson_oid_init (void)
{
   bson_context_t *context;
   bson_oid_t oid;
   bson_oid_t oid2;
   int i;

   context = bson_context_new (BSON_CONTEXT_NONE);
   bson_oid_init (&oid, context);
   for (i = 0; i < 10000; i++) {
      bson_oid_init (&oid2, context);
      BSON_ASSERT (false == bson_oid_equal (&oid, &oid2));
      BSON_ASSERT (0 > bson_oid_compare (&oid, &oid2));
      bson_oid_copy (&oid2, &oid);
   }
   bson_context_destroy (context);

   /*
    * Test that the shared context works.
    */
   bson_oid_init (&oid, NULL);
   BSON_ASSERT (bson_context_get_default ());
}